

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::word_end(Fl_Input_ *this,int i)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  undefined4 local_1c;
  int i_local;
  Fl_Input_ *this_local;
  
  iVar1 = input_type(this);
  local_1c = i;
  if (iVar1 == 5) {
    this_local._4_4_ = size(this);
  }
  else {
    while( true ) {
      iVar1 = size(this);
      bVar3 = false;
      if ((int)local_1c < iVar1) {
        pcVar2 = index(this,(char *)(ulong)local_1c,iVar1);
        iVar1 = isword((char)pcVar2);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
    }
    while( true ) {
      iVar1 = size(this);
      bVar3 = false;
      if ((int)local_1c < iVar1) {
        pcVar2 = index(this,(char *)(ulong)local_1c,iVar1);
        iVar1 = isword((char)pcVar2);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::word_end(int i) const {
  if (input_type() == FL_SECRET_INPUT) return size();
  while (i < size() && !isword(index(i))) i++;
  while (i < size() && isword(index(i))) i++;
  return i;
}